

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrFoveationApplyInfoHTC *value)

{
  bool bVar1;
  NextChainResult NVar2;
  XrResult XVar3;
  long lVar4;
  XrResult XVar5;
  ulong uVar6;
  uint32_t in_stack_fffffffffffffcfc;
  allocator local_2f9;
  GenValidUsageXrInstanceInfo *local_2f8;
  string *local_2f0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_2e8;
  string local_2e0;
  allocator local_2b9;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  string local_298;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_238;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_220;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_208;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c0;
  string error_message;
  
  XVar5 = XR_SUCCESS;
  local_2f8 = instance_info;
  local_2f0 = command_name;
  local_2e8 = objects_info;
  if (value->type != XR_TYPE_FOVEATION_APPLY_INFO_HTC) {
    XVar5 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrFoveationApplyInfoHTC",value->type,
               "VUID-XrFoveationApplyInfoHTC-type-type",XR_TYPE_FOVEATION_APPLY_INFO_HTC,
               "XR_TYPE_FOVEATION_APPLY_INFO_HTC");
  }
  if (!check_pnext) goto LAB_001a1a02;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  error_message._M_dataplus._M_p._0_4_ = 0x3b9fa432;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9fa431;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  NVar2 = ValidateNextChain(local_2f8,local_2f0,local_2e8,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar2 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_2e0);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_2e0,local_2f8,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::string
              ((string *)&local_2e0,"VUID-XrFoveationApplyInfoHTC-next-unique",&local_2f9);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1d8,local_2e8);
    std::__cxx11::string::string
              ((string *)&local_298,
               "Multiple structures of the same type(s) in \"next\" chain for XrFoveationApplyInfoHTC struct"
               ,&local_2b9);
    CoreValidLogMessage(local_2f8,&local_2e0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1d8,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1d8);
    std::__cxx11::string::~string((string *)&local_2e0);
LAB_001a19cd:
    std::__cxx11::string::~string((string *)&error_message);
    XVar5 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar2 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrFoveationApplyInfoHTC-next-next",
               (allocator *)&local_298);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1c0,local_2e8);
    std::__cxx11::string::string
              ((string *)&local_2e0,
               "Invalid structure(s) in \"next\" chain for XrFoveationApplyInfoHTC struct \"next\"",
               &local_2f9);
    CoreValidLogMessage(local_2f8,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1c0,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1c0);
    goto LAB_001a19cd;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_001a1a02:
  if (!check_members || XVar5 != XR_SUCCESS) {
    return XVar5;
  }
  std::__cxx11::string::string
            ((string *)&error_message,"XrFoveationApplyInfoHTC",(allocator *)&local_298);
  std::__cxx11::string::string((string *)&local_2e0,"mode",(allocator *)&valid_ext_structs);
  bVar1 = ValidateXrEnum(local_2f8,local_2f0,&error_message,&local_2e0,local_2e8,value->mode);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&error_message);
  if (bVar1) {
    XVar5 = XR_SUCCESS;
    if ((value->subImageCount == 0) && (value->subImages != (XrSwapchainSubImage *)0x0)) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrFoveationApplyInfoHTC-subImageCount-arraylength",
                 (allocator *)&local_298);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_208,local_2e8);
      std::__cxx11::string::string
                ((string *)&local_2e0,
                 "Structure XrFoveationApplyInfoHTC member subImageCount is non-optional and must be greater than 0"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(local_2f8,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f0,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_208,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_208);
      std::__cxx11::string::~string((string *)&error_message);
      XVar5 = XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->subImages != (XrSwapchainSubImage *)0x0) {
      uVar6 = 0xffffffffffffffff;
      lVar4 = 0;
      do {
        uVar6 = uVar6 + 1;
        if (value->subImageCount <= uVar6) {
          return XVar5;
        }
        XVar5 = XR_SUCCESS;
        XVar3 = ValidateXrStruct(local_2f8,local_2f0,local_2e8,true,false,
                                 (XrSwapchainSubImage *)((long)&value->subImages->swapchain + lVar4)
                                );
        lVar4 = lVar4 + 0x20;
      } while (XVar3 == XR_SUCCESS);
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrFoveationApplyInfoHTC-subImages-parameter",
                 (allocator *)&local_298);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_238,local_2e8);
      std::__cxx11::string::string
                ((string *)&local_2e0,
                 "Structure XrFoveationApplyInfoHTC member subImages is invalid",
                 (allocator *)&valid_ext_structs);
      CoreValidLogMessage(local_2f8,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f0,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_238,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_238);
      std::__cxx11::string::~string((string *)&error_message);
      return XVar3;
    }
    if (value->subImageCount == 0) {
      return XVar5;
    }
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrFoveationApplyInfoHTC-subImages-parameter",
               (allocator *)&local_298);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_220,local_2e8);
    std::__cxx11::string::string
              ((string *)&local_2e0,
               "XrFoveationApplyInfoHTC contains invalid NULL for XrSwapchainSubImage \"subImages\" is which not optional since \"subImageCount\" is set and must be non-NULL"
               ,(allocator *)&valid_ext_structs);
    CoreValidLogMessage(local_2f8,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_220,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_220);
    std::__cxx11::string::~string((string *)&error_message);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,
                    "XrFoveationApplyInfoHTC contains invalid XrFoveationModeHTC \"mode\" enum value "
                   );
    Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffcfc);
    std::operator<<((ostream *)&error_message,(string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::string
              ((string *)&local_2e0,"VUID-XrFoveationApplyInfoHTC-mode-parameter",
               (allocator *)&valid_ext_structs);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1f0,local_2e8);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(local_2f8,&local_2e0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1f0,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1f0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
  }
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrFoveationApplyInfoHTC* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_FOVEATION_APPLY_INFO_HTC) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrFoveationApplyInfoHTC",
                             value->type, "VUID-XrFoveationApplyInfoHTC-type-type", XR_TYPE_FOVEATION_APPLY_INFO_HTC, "XR_TYPE_FOVEATION_APPLY_INFO_HTC");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        valid_ext_structs.push_back(XR_TYPE_FOVEATION_CUSTOM_MODE_INFO_HTC);
        valid_ext_structs.push_back(XR_TYPE_FOVEATION_DYNAMIC_MODE_INFO_HTC);
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrFoveationApplyInfoHTC-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrFoveationApplyInfoHTC struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrFoveationApplyInfoHTC : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrFoveationApplyInfoHTC-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrFoveationApplyInfoHTC struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrFoveationModeHTC value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrFoveationApplyInfoHTC", "mode", objects_info, value->mode)) {
        std::ostringstream oss_enum;
        oss_enum << "XrFoveationApplyInfoHTC contains invalid XrFoveationModeHTC \"mode\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->mode));
        CoreValidLogMessage(instance_info, "VUID-XrFoveationApplyInfoHTC-mode-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->subImageCount && nullptr != value->subImages) {
        CoreValidLogMessage(instance_info, "VUID-XrFoveationApplyInfoHTC-subImageCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrFoveationApplyInfoHTC member subImageCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->subImages && 0 != value->subImageCount) {
        CoreValidLogMessage(instance_info, "VUID-XrFoveationApplyInfoHTC-subImages-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrFoveationApplyInfoHTC contains invalid NULL for XrSwapchainSubImage \"subImages\" is which not "
                            "optional since \"subImageCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->subImages) {
        for (uint32_t value_subimages_inc = 0; value_subimages_inc < value->subImageCount; ++value_subimages_inc) {
            // Validate that the structure XrSwapchainSubImage is valid
            xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                             check_members, true, &value->subImages[value_subimages_inc]);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(instance_info, "VUID-XrFoveationApplyInfoHTC-subImages-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    "Structure XrFoveationApplyInfoHTC member subImages is invalid");
                return xr_result;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}